

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HBondJump.cpp
# Opt level: O2

void __thiscall OpenMD::HBondJump::findHBonds(HBondJump *this,int frame)

{
  int hIndex;
  bool bVar1;
  Molecule *pMVar2;
  HBondDonor *pHVar3;
  Molecule *pMVar4;
  pointer ppAVar5;
  pointer ppHVar6;
  Atom *pAVar7;
  MoleculeIterator mj;
  MoleculeIterator mi;
  Vector3d aPos;
  Vector3d hPos;
  Vector3d dPos;
  pointer local_160;
  MoleculeIterator local_158;
  MoleculeIterator local_150;
  Atom *local_148;
  Molecule *local_140;
  Molecule *local_138;
  Molecule *local_130;
  long local_128;
  Vector<double,_3U> local_120;
  Vector<double,_3U> local_108;
  Vector<double,_3U> local_f0;
  Vector<double,_3U> local_d8;
  Vector<double,_3U> local_c0;
  Vector<double,_3U> local_a8;
  Vector<double,_3U> local_90;
  Vector<double,_3U> local_78;
  Vector<double,_3U> local_60;
  Vector<double,_3U> local_48;
  
  local_150._M_node = (_Base_ptr)0x0;
  local_158._M_node = (_Base_ptr)0x0;
  Vector<double,_3U>::Vector(&local_d8);
  Vector<double,_3U>::Vector(&local_f0);
  Vector<double,_3U>::Vector(&local_108);
  pMVar2 = SimInfo::beginMolecule((this->super_TimeCorrFunc<double>).info_,&local_150);
  while (pMVar2 != (Molecule *)0x0) {
    ppHVar6 = (pMVar2->hBondDonors_).
              super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (ppHVar6 !=
        (pMVar2->hBondDonors_).
        super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) goto LAB_00134c61;
    pHVar3 = (HBondDonor *)0x0;
    while (pHVar3 != (HBondDonor *)0x0) {
      (*(this->super_TimeCorrFunc<double>).super_DynamicProperty._vptr_DynamicProperty[0x14])
                (this,(ulong)(uint)frame,
                 (ulong)(uint)(pHVar3->donatedHydrogen->super_StuntDouble).globalIndex_);
      ppHVar6 = ppHVar6 + 1;
      pHVar3 = (HBondDonor *)0x0;
      if (ppHVar6 !=
          (pMVar2->hBondDonors_).
          super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
LAB_00134c61:
        pHVar3 = *ppHVar6;
      }
    }
    pMVar2 = SimInfo::nextMolecule((this->super_TimeCorrFunc<double>).info_,&local_150);
  }
  pMVar2 = SimInfo::beginMolecule((this->super_TimeCorrFunc<double>).info_,&local_150);
  local_128 = (long)frame;
  while (pMVar2 != (Molecule *)0x0) {
    local_160 = (pointer)(pMVar2->hBondDonors_).
                         super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                         ._M_impl.super__Vector_impl_data._M_start;
    local_130 = pMVar2;
    if (local_160 !=
        (pointer)(pMVar2->hBondDonors_).
                 super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish) goto LAB_00134e7b;
    pHVar3 = (HBondDonor *)0x0;
    while (pHVar3 != (HBondDonor *)0x0) {
      local_140 = (Molecule *)(long)(pHVar3->donatedHydrogen->super_StuntDouble).globalIndex_;
      local_148 = (Atom *)CONCAT44(local_148._4_4_,
                                   *(undefined4 *)
                                    (*(long *)&(this->GIDtoH_).
                                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start[local_128].
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data + (long)local_140 * 4));
      StuntDouble::getPos((Vector3d *)&local_120,&pHVar3->donorAtom->super_StuntDouble);
      Vector<double,_3U>::operator=(&local_d8,&local_120);
      StuntDouble::getPos((Vector3d *)&local_120,&pHVar3->donatedHydrogen->super_StuntDouble);
      Vector<double,_3U>::operator=(&local_f0,&local_120);
      local_158._M_node = local_150._M_node;
      pMVar4 = SimInfo::beginMolecule((this->super_TimeCorrFunc<double>).info_,&local_158);
      while (pMVar4 != (Molecule *)0x0) {
        ppAVar5 = (pMVar4->hBondAcceptors_).
                  super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        local_138 = pMVar4;
        if (ppAVar5 !=
            (pMVar4->hBondAcceptors_).
            super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
            super__Vector_impl_data._M_finish) goto LAB_00134e32;
        pAVar7 = (Atom *)0x0;
        while (pAVar7 != (Atom *)0x0) {
          StuntDouble::getPos((Vector3d *)&local_120,&pAVar7->super_StuntDouble);
          Vector<double,_3U>::operator=(&local_108,&local_120);
          Vector<double,_3U>::Vector(&local_48,&local_d8);
          Vector<double,_3U>::Vector(&local_60,&local_f0);
          Vector<double,_3U>::Vector(&local_78,&local_108);
          bVar1 = isHBond(this,(Vector3d *)&local_48,(Vector3d *)&local_60,(Vector3d *)&local_78);
          if (bVar1) {
            registerHydrogenBond
                      (this,frame,(int)local_148,(int)local_140,
                       (pAVar7->super_StuntDouble).globalIndex_);
          }
          ppAVar5 = ppAVar5 + 1;
          pAVar7 = (Atom *)0x0;
          if (ppAVar5 !=
              (local_138->hBondAcceptors_).
              super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
              super__Vector_impl_data._M_finish) {
LAB_00134e32:
            pAVar7 = *ppAVar5;
          }
        }
        pMVar4 = SimInfo::nextMolecule((this->super_TimeCorrFunc<double>).info_,&local_158);
        pMVar2 = local_130;
      }
      local_160 = local_160 + 1;
      pHVar3 = (HBondDonor *)0x0;
      if (local_160 !=
          (pointer)(pMVar2->hBondDonors_).
                   super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish) {
LAB_00134e7b:
        pHVar3 = (HBondDonor *)*local_160;
      }
    }
    local_160 = (pMVar2->hBondAcceptors_).
                super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    if (local_160 !=
        (pMVar2->hBondAcceptors_).
        super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_0013505a;
    pAVar7 = (Atom *)0x0;
    while (pAVar7 != (Atom *)0x0) {
      local_148 = pAVar7;
      StuntDouble::getPos((Vector3d *)&local_120,&pAVar7->super_StuntDouble);
      Vector<double,_3U>::operator=(&local_108,&local_120);
      local_158._M_node = local_150._M_node;
      pMVar4 = SimInfo::beginMolecule((this->super_TimeCorrFunc<double>).info_,&local_158);
      while (pMVar4 != (Molecule *)0x0) {
        ppHVar6 = (pMVar4->hBondDonors_).
                  super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_140 = pMVar4;
        if (ppHVar6 !=
            (pMVar4->hBondDonors_).
            super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
            ._M_impl.super__Vector_impl_data._M_finish) goto LAB_00135011;
        pHVar3 = (HBondDonor *)0x0;
        while (pHVar3 != (HBondDonor *)0x0) {
          hIndex = (pHVar3->donatedHydrogen->super_StuntDouble).globalIndex_;
          local_138 = (Molecule *)
                      CONCAT44(local_138._4_4_,
                               *(undefined4 *)
                                (*(long *)&(this->GIDtoH_).
                                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[local_128].
                                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                           super__Vector_impl_data + (long)hIndex * 4));
          StuntDouble::getPos((Vector3d *)&local_120,&pHVar3->donorAtom->super_StuntDouble);
          Vector<double,_3U>::operator=(&local_d8,&local_120);
          StuntDouble::getPos((Vector3d *)&local_120,&pHVar3->donatedHydrogen->super_StuntDouble);
          Vector<double,_3U>::operator=(&local_f0,&local_120);
          Vector<double,_3U>::Vector(&local_90,&local_d8);
          Vector<double,_3U>::Vector(&local_a8,&local_f0);
          Vector<double,_3U>::Vector(&local_c0,&local_108);
          bVar1 = isHBond(this,(Vector3d *)&local_90,(Vector3d *)&local_a8,(Vector3d *)&local_c0);
          if (bVar1) {
            registerHydrogenBond
                      (this,frame,(int)local_138,hIndex,(local_148->super_StuntDouble).globalIndex_)
            ;
          }
          ppHVar6 = ppHVar6 + 1;
          pHVar3 = (HBondDonor *)0x0;
          if (ppHVar6 !=
              (local_140->hBondDonors_).
              super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
LAB_00135011:
            pHVar3 = *ppHVar6;
          }
        }
        pMVar4 = SimInfo::nextMolecule((this->super_TimeCorrFunc<double>).info_,&local_158);
        pMVar2 = local_130;
      }
      local_160 = local_160 + 1;
      pAVar7 = (Atom *)0x0;
      if (local_160 !=
          (pMVar2->hBondAcceptors_).
          super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
LAB_0013505a:
        pAVar7 = *local_160;
      }
    }
    pMVar2 = SimInfo::nextMolecule((this->super_TimeCorrFunc<double>).info_,&local_150);
  }
  return;
}

Assistant:

void HBondJump::findHBonds(int frame) {
    Molecule* mol1;
    Molecule* mol2;
    SimInfo::MoleculeIterator mi, mj;
    std::vector<Molecule::HBondDonor*>::iterator hbdi;
    Molecule::HBondDonor* hbd;
    std::vector<Atom*>::iterator hbai;
    Atom* hba;
    Vector3d dPos, hPos, aPos;
    int hInd, index, aInd;

    // Register all the possible HBond donor hydrogens:
    for (mol1 = info_->beginMolecule(mi); mol1 != NULL;
         mol1 = info_->nextMolecule(mi)) {
      for (hbd = mol1->beginHBondDonor(hbdi); hbd != NULL;
           hbd = mol1->nextHBondDonor(hbdi)) {
        hInd  = hbd->donatedHydrogen->getGlobalIndex();
        index = registerHydrogen(frame, hInd);
      }
    }

    for (mol1 = info_->beginMolecule(mi); mol1 != NULL;
         mol1 = info_->nextMolecule(mi)) {
      for (hbd = mol1->beginHBondDonor(hbdi); hbd != NULL;
           hbd = mol1->nextHBondDonor(hbdi)) {
        hInd  = hbd->donatedHydrogen->getGlobalIndex();
        index = GIDtoH_[frame][hInd];

        dPos = hbd->donorAtom->getPos();
        hPos = hbd->donatedHydrogen->getPos();

        for (mj = mi, mol2 = info_->beginMolecule(mj); mol2 != NULL;
             mol2 = info_->nextMolecule(mj)) {
          for (hba = mol2->beginHBondAcceptor(hbai); hba != NULL;
               hba = mol2->nextHBondAcceptor(hbai)) {
            aPos = hba->getPos();

            if (isHBond(dPos, hPos, aPos)) {
              aInd = hba->getGlobalIndex();
              registerHydrogenBond(frame, index, hInd, aInd);
            }
          }
        }
      }

      for (hba = mol1->beginHBondAcceptor(hbai); hba != NULL;
           hba = mol1->nextHBondAcceptor(hbai)) {
        aPos = hba->getPos();

        for (mj = mi, mol2 = info_->beginMolecule(mj); mol2 != NULL;
             mol2 = info_->nextMolecule(mj)) {
          for (hbd = mol2->beginHBondDonor(hbdi); hbd != NULL;
               hbd = mol2->nextHBondDonor(hbdi)) {
            hInd = hbd->donatedHydrogen->getGlobalIndex();
            // no need to register, just look up the index:
            index = GIDtoH_[frame][hInd];

            dPos = hbd->donorAtom->getPos();
            hPos = hbd->donatedHydrogen->getPos();

            if (isHBond(dPos, hPos, aPos)) {
              aInd = hba->getGlobalIndex();
              registerHydrogenBond(frame, index, hInd, aInd);
            }
          }
        }
      }
    }
  }